

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-buffer.c
# Opt level: O2

void test_init(void)

{
  int iVar1;
  BUFFER buf;
  
  buf.data = (void *)0x0;
  buf.size = 0;
  buf.alloc = 0;
  buffer_append(&buf,"hello",5);
  acutest_check_((uint)(buf.size == 5),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-buffer.c"
                 ,0x27,"%s","buf.size == 5");
  acutest_check_((uint)(buf.size <= buf.alloc),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-buffer.c"
                 ,0x28,"%s","buf.alloc >= buf.size");
  iVar1 = bcmp(buf.data,"hello",5);
  acutest_check_((uint)(iVar1 == 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-buffer.c"
                 ,0x29,"%s","memcmp(buf.data, \"hello\", 5) == 0");
  free(buf.data);
  return;
}

Assistant:

static void
test_init(void)
{
    BUFFER buf;

    buffer_init(&buf);

    buffer_append(&buf, "hello", 5);

    TEST_CHECK(buf.size == 5);
    TEST_CHECK(buf.alloc >= buf.size);
    TEST_CHECK(memcmp(buf.data, "hello", 5) == 0);

    buffer_fini(&buf);
}